

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O3

target_ulong helper_rdrand_x86_64(CPUX86State *env)

{
  int iVar1;
  target_ulong ret;
  target_ulong local_10;
  
  iVar1 = qemu_guest_getrandom(&local_10,8);
  if (iVar1 < 0) {
    local_10 = 0;
  }
  env->cc_src = (ulong)(iVar1 >= 0);
  return local_10;
}

Assistant:

target_ulong HELPER(rdrand)(CPUX86State *env)
{
    target_ulong ret;

    if (qemu_guest_getrandom(&ret, sizeof(ret)) < 0) {
        // qemu_log_mask(LOG_UNIMP, "rdrand: Crypto failure: %s",
        //               error_get_pretty(err));
        // error_free(err);
        /* Failure clears CF and all other flags, and returns 0.  */
        env->cc_src = 0;
        return 0;
    }

    /* Success sets CF and clears all others.  */
    env->cc_src = CC_C;
    return ret;
}